

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutnode.h
# Opt level: O0

void __thiscall rengine::LayoutEngine::updateLayout(LayoutEngine *this,Node *parentNode)

{
  bool bVar1;
  int iVar2;
  RectangleNodeBase *pRVar3;
  float *pfVar4;
  int __x;
  LayoutEngine *pLVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar6;
  float local_128;
  float local_11c;
  float local_108;
  float local_fc;
  bool local_ed;
  float local_ec;
  float local_e4;
  float local_e0;
  float local_d8;
  float local_d4;
  int local_c8;
  int local_c4;
  int local_c0;
  float local_ac;
  float local_a8;
  bool local_a1;
  float local_a0;
  float fStack_9c;
  bool fitsOnLine;
  float end;
  float dim;
  RectangleNodeBase *rectNode_1;
  Node *node_1;
  float offsetIncrement;
  float offset;
  float pos;
  float offsetSign;
  float posSign;
  float sizeLimit;
  int itemLimit;
  int index_1;
  rect2d local_58;
  int local_48;
  int local_44;
  int c;
  int r;
  RectangleNodeBase *rectNode;
  Node *node;
  int itemsPer;
  float ySign;
  float xSign;
  float ch;
  float cw;
  int index;
  Node *parentNode_local;
  LayoutEngine *this_local;
  
  _cw = parentNode;
  parentNode_local = (Node *)this;
  if (((this->field_0x28 & 3) == 0) || ((this->field_0x28 & 3) == 1)) {
    bVar1 = true;
    if ((this->cellWidth == 0.0) && (!NAN(this->cellWidth))) {
      bVar1 = false;
      if ((this->width != 0.0) || (NAN(this->width))) {
        bVar1 = 0 < this->columnCount;
      }
    }
    if (!bVar1) {
      __assert_fail("cellWidth != 0 || (width != 0 && columnCount > 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                    ,0xdb,"void rengine::LayoutEngine::updateLayout(Node *)");
    }
    bVar1 = true;
    if ((this->cellHeight == 0.0) && (!NAN(this->cellHeight))) {
      bVar1 = false;
      if ((this->height != 0.0) || (NAN(this->height))) {
        bVar1 = 0 < this->rowCount;
      }
    }
    if (!bVar1) {
      __assert_fail("cellHeight != 0 || (height != 0 && rowCount > 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                    ,0xdc,"void rengine::LayoutEngine::updateLayout(Node *)");
    }
    ch = 0.0;
    if ((this->cellHeight != 0.0) || (NAN(this->cellHeight))) {
      pLVar5 = this;
      std::abs((int)this);
      __x = (int)pLVar5;
      iVar2 = -1;
      xSign = extraout_XMM0_Da;
      if (0.0 < this->cellWidth) {
        iVar2 = 1;
      }
    }
    else {
      pLVar5 = this;
      std::abs((int)this);
      __x = (int)pLVar5;
      xSign = (-(float)(this->columnCount + -1) * this->spacing +
              (extraout_XMM0_Da_00 - (this->margin + this->margin))) / (float)this->columnCount;
      iVar2 = -1;
      if (0.0 < this->width) {
        iVar2 = 1;
      }
    }
    itemsPer = (int)(float)iVar2;
    if ((this->cellHeight != 0.0) || (NAN(this->cellHeight))) {
      std::abs(__x);
      iVar2 = 1;
      ySign = extraout_XMM0_Da_01;
      if (this->cellHeight < 0.0) {
        iVar2 = -1;
      }
    }
    else {
      std::abs(__x);
      ySign = (-(float)(this->rowCount + -1) * this->spacing +
              (extraout_XMM0_Da_02 - (this->margin + this->margin))) / (float)this->rowCount;
      iVar2 = 1;
      if (this->height < 0.0) {
        iVar2 = -1;
      }
    }
    node._4_4_ = (float)iVar2;
    if ((this->field_0x28 & 3) == 0) {
      if (this->columnCount < 1) {
        local_c0 = std::numeric_limits<int>::max();
      }
      else {
        local_c0 = this->columnCount;
      }
      local_c4 = local_c0;
    }
    else {
      if (this->rowCount < 1) {
        local_c8 = std::numeric_limits<int>::max();
      }
      else {
        local_c8 = this->rowCount;
      }
      local_c4 = local_c8;
    }
    node._0_4_ = local_c4;
    for (rectNode = (RectangleNodeBase *)Node::child(_cw); rectNode != (RectangleNodeBase *)0x0;
        rectNode = (RectangleNodeBase *)Node::sibling(&rectNode->super_Node)) {
      pRVar3 = RectangleNodeBase::from(&rectNode->super_Node);
      _c = pRVar3;
      if (pRVar3 != (RectangleNodeBase *)0x0) {
        if ((this->field_0x28 & 3) == 0) {
          local_44 = (int)ch / (int)node;
          local_48 = (int)ch % (int)node;
        }
        else {
          local_44 = (int)ch % (int)node;
          local_48 = (int)ch / (int)node;
        }
        _itemLimit = rect2d::fromXywh((float)itemsPer *
                                      ((float)local_48 * this->spacing +
                                      (float)local_48 * xSign + this->margin) + this->x,
                                      node._4_4_ *
                                      ((float)local_44 * this->spacing +
                                      (float)local_44 * ySign + this->margin) + this->y,
                                      (float)itemsPer * xSign,node._4_4_ * ySign);
        local_58 = rect2d::normalized((rect2d *)&itemLimit);
        RectangleNodeBase::setGeometry(pRVar3,local_58);
        ch = (float)((int)ch + 1);
      }
    }
  }
  else {
    sizeLimit = 0.0;
    if ((this->field_0x28 & 3) == 2) {
      iVar2 = 1;
      if (this->width < 0.0) {
        iVar2 = -1;
      }
      pos = (float)iVar2;
      iVar2 = 1;
      if (this->height < 0.0) {
        iVar2 = -1;
      }
      offset = (float)iVar2;
      if (this->columnCount < 1) {
        local_d4 = (float)std::numeric_limits<int>::max();
      }
      else {
        local_d4 = (float)this->columnCount;
      }
      local_d8 = pos;
      posSign = local_d4;
      if ((this->width != 0.0) || (NAN(this->width))) {
        fVar6 = -(pos * this->margin);
        local_d8 = fVar6 + fVar6 + this->width;
      }
      else {
        fVar6 = std::numeric_limits<float>::infinity();
        local_d8 = local_d8 * fVar6;
      }
      offsetSign = local_d8;
    }
    else {
      iVar2 = 1;
      if (this->height < 0.0) {
        iVar2 = -1;
      }
      pos = (float)iVar2;
      iVar2 = 1;
      if (this->width < 0.0) {
        iVar2 = -1;
      }
      offset = (float)iVar2;
      if (this->rowCount < 1) {
        local_e0 = (float)std::numeric_limits<int>::max();
      }
      else {
        local_e0 = (float)this->rowCount;
      }
      local_e4 = pos;
      posSign = local_e0;
      if ((this->height != 0.0) || (NAN(this->height))) {
        fVar6 = -(pos * this->margin);
        local_e4 = fVar6 + fVar6 + this->height;
      }
      else {
        fVar6 = std::numeric_limits<float>::infinity();
        local_e4 = local_e4 * fVar6;
      }
      offsetSign = local_e4;
    }
    offsetIncrement = pos * this->margin;
    node_1._4_4_ = offset * this->margin;
    node_1._0_4_ = 0.0;
    rectNode_1 = (RectangleNodeBase *)Node::child(_cw);
    while (rectNode_1 != (RectangleNodeBase *)0x0) {
      _end = RectangleNodeBase::from(&rectNode_1->super_Node);
      if (_end == (RectangleNodeBase *)0x0) {
        rectNode_1 = (RectangleNodeBase *)Node::sibling(&rectNode_1->super_Node);
      }
      else {
        if ((this->field_0x28 & 3) == 2) {
          local_ec = RectangleNodeBase::width(_end);
        }
        else {
          local_ec = RectangleNodeBase::height(_end);
        }
        fStack_9c = local_ec;
        local_a0 = pos * local_ec + offsetIncrement;
        local_ed = pos * local_a0 <= pos * offsetSign && (int)sizeLimit < (int)posSign;
        local_a1 = local_ed;
        if ((local_ed) || (sizeLimit == 0.0)) {
          if ((this->field_0x28 & 3) == 2) {
            local_a8 = RectangleNodeBase::height(_end);
            pfVar4 = std::max<float>((float *)&node_1,&local_a8);
            local_fc = offsetIncrement;
            pRVar3 = _end;
            node_1._0_4_ = *pfVar4;
            if (this->x + pos <= 0.0) {
              fVar6 = RectangleNodeBase::width(_end);
              local_fc = local_fc - fVar6;
            }
            else {
            }
            local_108 = node_1._4_4_;
            if (this->y + offset <= 0.0) {
              fVar6 = RectangleNodeBase::height(_end);
              local_108 = local_108 - fVar6;
            }
            else {
            }
            RectangleNodeBase::setPosition(pRVar3,local_fc,local_108);
          }
          else {
            local_ac = RectangleNodeBase::width(_end);
            pfVar4 = std::max<float>((float *)&node_1,&local_ac);
            local_11c = node_1._4_4_;
            pRVar3 = _end;
            node_1._0_4_ = *pfVar4;
            if (this->x + offset <= 0.0) {
              fVar6 = RectangleNodeBase::width(_end);
              local_11c = local_11c - fVar6;
            }
            else {
            }
            local_128 = offsetIncrement;
            if (this->y + pos <= 0.0) {
              fVar6 = RectangleNodeBase::height(_end);
              local_128 = local_128 - fVar6;
            }
            else {
            }
            RectangleNodeBase::setPosition(pRVar3,local_11c,local_128);
          }
          sizeLimit = (float)((int)sizeLimit + 1);
          offsetIncrement = pos * this->spacing + local_a0;
          rectNode_1 = (RectangleNodeBase *)Node::sibling(&rectNode_1->super_Node);
        }
        else {
          node_1._4_4_ = offset * (node_1._0_4_ + this->spacing) + node_1._4_4_;
          offsetIncrement = pos * this->margin;
          sizeLimit = 0.0;
        }
      }
    }
  }
  return;
}

Assistant:

void LayoutEngine::updateLayout(Node *parentNode)
{
    if (layoutType == Grid_Horizontal || layoutType == Grid_Vertical) {
        assert(cellWidth != 0 || (width != 0 && columnCount > 0));
        assert(cellHeight != 0 || (height != 0 && rowCount > 0));

        int index = 0;

        float cw, ch, xSign, ySign;

        if (cellHeight != 0) {
             cw = std::abs(cellWidth);
             xSign = cellWidth > 0 ? 1 : -1;
        } else {
            cw = (std::abs(width) - 2 * margin - (columnCount - 1) * spacing) / columnCount;
            xSign = width > 0 ? 1 : -1;
        }

        if (cellHeight != 0) {
            ch = std::abs(cellHeight);
            ySign = cellHeight < 0 ? -1 : 1;
        } else {
            ch = (std::abs(height) - 2 * margin - (rowCount - 1) * spacing) / rowCount;
            ySign = height < 0 ? -1 : 1;
        }

        logd << (layoutType == Grid_Horizontal ? "horizontal" : "vertical")
             << "-grid: cell=" << cw << "x" << ch
             << ", dim=" << width << "x" << height << ", margin=" << margin << ", spacing=" << spacing
             << std::endl;

        const int itemsPer = layoutType == Grid_Horizontal
                             ? (columnCount > 0 ? columnCount : std::numeric_limits<int>::max())
                             : (rowCount > 0 ? rowCount : std::numeric_limits<int>::max());
        Node *node = parentNode->child();
        while (node) {
            RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
            if (rectNode) {
                int r, c;
                if (layoutType == Grid_Horizontal) {
                    r = index / itemsPer;
                    c = index % itemsPer;
                } else {
                    r = index % itemsPer;
                    c = index / itemsPer;
                }

                rectNode->setGeometry(rect2d::fromXywh(x + xSign * (margin + c * cw + c * spacing),
                                                       y + ySign * (margin + r * ch + r * spacing),
                                                       xSign * cw,
                                                       ySign * ch).normalized());
                ++index;
            }
            node = node->sibling();
        }

    } else {

        int index = 0;
        int itemLimit;
        float sizeLimit;

        float posSign, offsetSign;

        if (layoutType == Flow_Horizontal) {
            posSign = width < 0 ? -1 : 1;
            offsetSign = height < 0 ? -1 : 1;
            itemLimit = columnCount > 0 ? columnCount : std::numeric_limits<int>::max();
            sizeLimit = width != 0 ? width - posSign * margin * 2 : posSign * std::numeric_limits<float>::infinity();
        } else {
            posSign = height < 0 ? -1 : 1;
            offsetSign = width < 0 ? -1 : 1;
            itemLimit = rowCount > 0 ? rowCount : std::numeric_limits<int>::max();
            sizeLimit = height != 0 ? height - posSign * margin * 2 : posSign * std::numeric_limits<float>::infinity();
        }

        float pos = posSign * margin; // The position to place the node on the current line
        float offset = offsetSign * margin; // The position in the direction normal to the pos
        float offsetIncrement = 0;

        logd << (layoutType == Flow_Horizontal ? "horizontal" : "vertical")
             << "-flow: itemLimit=" << itemLimit << ", sizeLimit=" << sizeLimit
             << ", margin=" << margin << ", spacing=" << spacing
             << std::endl;

        Node *node = parentNode->child();
        while (node) {
            RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
            if (rectNode) {
                float dim = layoutType == Flow_Horizontal ? rectNode->width() : rectNode->height();
                float end = pos + posSign * dim;
                bool fitsOnLine = (posSign * end <= posSign * sizeLimit && index < itemLimit);
                logd << " - pos=" << pos << ", dim=" << dim << ", end=" << end  << ", index=" << index << ", fitsOnLine=" << fitsOnLine << std::endl;

                if (fitsOnLine || index == 0) {
                    if (layoutType == Flow_Horizontal) {
                        offsetIncrement = std::max(offsetIncrement, rectNode->height());
                        rectNode->setPosition(x + posSign > 0 ? pos : pos - rectNode->width(),
                                              y + offsetSign > 0 ? offset : offset - rectNode->height());
                    } else {
                        offsetIncrement = std::max(offsetIncrement, rectNode->width());
                        rectNode->setPosition(x + offsetSign > 0 ? offset : offset - rectNode->width(),
                                              y + posSign > 0 ? pos : pos - rectNode->height());
                    }
                    ++index;
                    pos = end + posSign * spacing;
                    node = node->sibling();
                } else {
                    // If it doesn't fit, wrap to the next line..
                    offset += offsetSign * (offsetIncrement + spacing);
                    pos = posSign * margin;
                    index = 0;
                }
            } else {
                node = node->sibling();
            }
        }
    }
}